

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::Assignment::dump_abi_cxx11_
          (string *__return_storage_ptr__,Assignment *this,int level)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  Assignment *pAStack_18;
  int level_local;
  Assignment *this_local;
  
  local_1c = level;
  pAStack_18 = this;
  this_local = (Assignment *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,(long)level,'\t',&local_a1);
  std::operator+(&local_80,&local_a0,"Assignment: ");
  std::operator+(&local_60,&local_80,&this->name);
  std::operator+(&local_40,&local_60," = ");
  pEVar1 = std::
           unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ::operator->(&this->value);
  (*(pEVar1->super_Statement).super_ASTElement._vptr_ASTElement[3])
            (&local_d8,pEVar1,(ulong)(local_1c + 1));
  std::operator+(__return_storage_ptr__,&local_40,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::Assignment::dump(int level) const {
    return std::string(level, '\t')+"Assignment: "+name+" = "+value->dump(level+1);
}